

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Node * mul(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  bool bVar1;
  C_Token *pCVar2;
  _Bool _Var3;
  C_Node *pCVar4;
  C_Node *pCVar5;
  C_Node *pCVar6;
  C_Token *local_48;
  C_Node *local_40;
  C_Token **local_38;
  
  local_48 = tok;
  local_38 = rest;
  pCVar4 = cast(parser,&local_48,tok);
  do {
    pCVar2 = local_48;
    _Var3 = C_equal(local_48,"*");
    if (_Var3) {
      pCVar5 = cast(parser,&local_48,local_48->next);
      pCVar6 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar6->kind = ND_MUL;
LAB_001275df:
      pCVar6->tok = pCVar2;
      pCVar6->lhs = pCVar4;
      pCVar6->rhs = pCVar5;
      bVar1 = true;
      pCVar4 = pCVar6;
    }
    else {
      _Var3 = C_equal(local_48,"/");
      if (_Var3) {
        pCVar5 = cast(parser,&local_48,local_48->next);
        pCVar6 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar6->kind = ND_DIV;
        goto LAB_001275df;
      }
      _Var3 = C_equal(local_48,"%");
      if (_Var3) {
        pCVar5 = cast(parser,&local_48,local_48->next);
        pCVar6 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar6->kind = ND_MOD;
        goto LAB_001275df;
      }
      *local_38 = local_48;
      bVar1 = false;
      local_40 = pCVar4;
    }
    if (!bVar1) {
      return local_40;
    }
  } while( true );
}

Assistant:

static C_Node *mul(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = cast(parser, &tok, tok);

  for (;;) {
    C_Token *start = tok;

    if (C_equal(tok, "*")) {
      node = new_binary(parser, ND_MUL, node, cast(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "/")) {
      node = new_binary(parser, ND_DIV, node, cast(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "%")) {
      node = new_binary(parser, ND_MOD, node, cast(parser, &tok, tok->next), start);
      continue;
    }

    *rest = tok;
    return node;
  }
}